

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageOperators.cpp
# Opt level: O0

void __thiscall
helics::MessageDataOperator::MessageDataOperator
          (MessageDataOperator *this,function<void_(helics::SmallBuffer_&)> *userDataFunction)

{
  function<void_(helics::SmallBuffer_&)> *in_RDI;
  function<void_(helics::SmallBuffer_&)> *in_stack_ffffffffffffffd8;
  
  FilterOperator::FilterOperator((FilterOperator *)in_RDI);
  *(undefined ***)&(in_RDI->super__Function_base)._M_functor = &PTR__MessageDataOperator_009238b8;
  std::function<void_(helics::SmallBuffer_&)>::function(in_RDI,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

MessageDataOperator::MessageDataOperator(std::function<void(SmallBuffer&)> userDataFunction):
    dataFunction(std::move(userDataFunction))
{
}